

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

void cvProcessError(CVodeMem cv_mem,int error_code,char *module,char *fname,char *msgfmt,...)

{
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char msg [256];
  undefined8 local_1f8;
  void **local_1f0;
  undefined1 *local_1e8;
  char local_1d8 [256];
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_1e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_1f8 = 0x3000000028;
  local_1f0 = &ap[0].overflow_arg_area;
  local_b0 = in_R9;
  vsprintf(local_1d8,msgfmt,&local_1f8);
  if (cv_mem == (CVodeMem)0x0) {
    fprintf(_stderr,"\n[%s ERROR]  %s\n  ",module,fname);
    fprintf(_stderr,"%s\n\n",local_1d8);
  }
  else {
    (*cv_mem->cv_ehfun)(error_code,module,fname,local_1d8,cv_mem->cv_eh_data);
  }
  return;
}

Assistant:

void cvProcessError(CVodeMem cv_mem,
                    int error_code, const char *module, const char *fname,
                    const char *msgfmt, ...)
{
  va_list ap;
  char msg[256];

  /* Initialize the argument pointer variable
     (msgfmt is the last required argument to cvProcessError) */

  va_start(ap, msgfmt);

  /* Compose the message */

  vsprintf(msg, msgfmt, ap);

  if (cv_mem == NULL) {    /* We write to stderr */
#ifndef NO_FPRINTF_OUTPUT
    fprintf(stderr, "\n[%s ERROR]  %s\n  ", module, fname);
    fprintf(stderr, "%s\n\n", msg);
#endif

  } else {                 /* We can call ehfun */
    cv_mem->cv_ehfun(error_code, module, fname, msg, cv_mem->cv_eh_data);
  }

  /* Finalize argument processing */
  va_end(ap);

  return;
}